

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O3

Token * __thiscall wabt::WastLexer::GetInfToken(Token *__return_storage_ptr__,WastLexer *this)

{
  byte *pbVar1;
  byte *pbVar2;
  int iVar3;
  byte *pbVar4;
  byte *pbVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  
  pbVar1 = (byte *)this->buffer_end_;
  pbVar2 = (byte *)this->cursor_;
  lVar8 = 0;
  pbVar4 = pbVar2;
  do {
    uVar9 = 0xffffffff;
    pbVar5 = pbVar4;
    if (pbVar4 < pbVar1) {
      pbVar5 = pbVar4 + 1;
      this->cursor_ = (char *)pbVar5;
      uVar9 = (uint)*pbVar4;
    }
    if (uVar9 != (int)"inf"[lVar8]) {
      this->cursor_ = (char *)pbVar2;
      GetKeywordToken(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    }
    lVar8 = lVar8 + 1;
    pbVar4 = pbVar5;
  } while (lVar8 != 3);
  if (pbVar5 < pbVar1) {
    iVar3 = (int)pbVar5;
    iVar6 = 0;
    do {
      iVar7 = iVar6;
      if ((""[(ulong)*pbVar5 + 1] & 1U) == 0) break;
      pbVar5 = pbVar5 + 1;
      this->cursor_ = (char *)pbVar5;
      iVar6 = iVar6 + 1;
      iVar7 = (int)pbVar1 - iVar3;
    } while (pbVar5 != pbVar1);
    if (iVar7 != 0) {
      GetReservedToken(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    }
  }
  LiteralToken(__return_storage_ptr__,this,First_Literal,Infinity);
  return __return_storage_ptr__;
}

Assistant:

Token WastLexer::GetInfToken() {
  if (MatchString("inf")) {
    if (NoTrailingReservedChars()) {
      return LiteralToken(TokenType::Float, LiteralType::Infinity);
    }
    return GetReservedToken();
  }
  return GetKeywordToken();
}